

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::scoutsubface(tetgenmesh *this,face *searchsh,triface *searchtet,int shflag)

{
  int *piVar1;
  tetrahedron *pppdVar2;
  shellface pa;
  tetrahedron ppdVar3;
  undefined8 uVar4;
  face *s;
  interresult iVar5;
  tetrahedron *pppdVar6;
  triface local_48;
  face *local_38;
  
  pa = searchsh->sh[sorgpivot[searchsh->shver]];
  ppdVar3 = searchsh->sh[sdestpivot[searchsh->shver]];
  point2tetorg(this,(point)pa,searchtet);
  iVar5 = finddirection(this,searchtet,(point)ppdVar3);
  if (iVar5 == ACROSSVERT) {
    if (searchtet->tet[destpivot[searchtet->ver]] != ppdVar3) {
      if (shflag == 0) {
        terminatetetgen(this,2);
      }
      else {
        report_selfint_edge(this,(point)pa,(point)ppdVar3,searchsh,searchtet,ACROSSVERT);
      }
    }
    ppdVar3 = searchsh->sh[sapexpivot[searchsh->shver]];
    pppdVar6 = searchtet->tet;
    uVar4._0_4_ = searchtet->ver;
    uVar4._4_4_ = *(undefined4 *)&searchtet->field_0xc;
    local_48._8_8_ = uVar4;
    local_38 = searchsh;
    do {
      s = local_38;
      if (pppdVar6[apexpivot[(int)(uint)uVar4]] == ppdVar3) {
        local_48.tet = pppdVar6;
        if ((pppdVar6[9] == (tetrahedron)0x0) || (pppdVar6[9][(uint)uVar4 & 3] == (double *)0x0)) {
          local_48.ver = (uint)uVar4;
          tsbond(this,&local_48,local_38);
          pppdVar6 = local_48.tet + (local_48.ver & 3);
          local_48.tet = (tetrahedron *)((ulong)*pppdVar6 & 0xfffffffffffffff0);
          local_48.ver = fsymtbl[local_48.ver][(uint)*pppdVar6 & 0xf];
          piVar1 = &s->shver;
          *(byte *)piVar1 = (byte)*piVar1 ^ 1;
          tsbond(this,&local_48,s);
          searchtet->tet = local_48.tet;
          searchtet->ver = local_48.ver;
          return 1;
        }
        terminatetetgen(this,2);
      }
      pppdVar2 = pppdVar6 + facepivot1[(int)(uint)uVar4];
      pppdVar6 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
      uVar4._0_4_ = facepivot2[(int)(uint)uVar4][(uint)*pppdVar2 & 0xf];
    } while (searchtet->tet != pppdVar6);
  }
  return 0;
}

Assistant:

int tetgenmesh::scoutsubface(face* searchsh, triface* searchtet, int shflag)
{
  point pa = sorg(*searchsh);
  point pb = sdest(*searchsh);

  // Get a tet whose origin is a.
  point2tetorg(pa, *searchtet);
  // Search the edge [a,b].
  enum interresult dir = finddirection(searchtet, pb);
  if (dir == ACROSSVERT) {
    // Check validity of a PLC.
    if (dest(*searchtet) != pb) {
	  if (shflag) {
        // A vertex lies on the search edge. 
	    report_selfint_edge(pa, pb, searchsh, searchtet, dir);
	  } else {
	    terminatetetgen(this, 2);
	  }
    }
	int t1ver;
    // The edge exists. Check if the face exists.
    point pc = sapex(*searchsh);
    // Searchtet holds edge [a,b]. Search a face with apex c.
    triface spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        // Found a face matching to 'searchsh'!
        if (!issubface(spintet)) {
          // Insert 'searchsh'.
          tsbond(spintet, *searchsh);
          fsymself(spintet);
          sesymself(*searchsh);
          tsbond(spintet, *searchsh);
          *searchtet = spintet;
          return 1; 
        } else {
          terminatetetgen(this, 2);
        }
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
  }

  return 0;
}